

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void HACD::performUnitTests(void)

{
  uint uVar1;
  NxU32 i;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  HeapManager *heap;
  void *pvVar6;
  int iVar7;
  NxU32 i_2;
  MyHeapManager *this;
  NxU32 i_1;
  bool bVar8;
  void *allocs [8192];
  undefined8 auStack_10028 [8192];
  
  for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 1) {
    auStack_10028[lVar5] = 0;
  }
  heap = createHeapManager(0x200000);
  srand(0);
  this = (MyHeapManager *)(heap + -1);
  iVar7 = 40000000;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    uVar2 = rand();
    if ((void *)auStack_10028[uVar2 & 0x1fff] == (void *)0x0) {
      uVar3 = rand();
      uVar4 = rand();
      uVar1 = (uVar3 & 0x3f) + 0x100;
      if ((uVar4 & 0x7f) != 0) {
        uVar1 = uVar3 & 0x3f;
      }
      pvVar6 = MyHeapManager::inline_heap_malloc(this,(ulong)uVar1);
    }
    else {
      MyHeapManager::inline_heap_free(this,(void *)auStack_10028[uVar2 & 0x1fff]);
      pvVar6 = (void *)0x0;
    }
    auStack_10028[uVar2 & 0x1fff] = pvVar6;
  }
  for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 1) {
    if ((void *)auStack_10028[lVar5] != (void *)0x0) {
      MyHeapManager::inline_heap_free(this,(void *)auStack_10028[lVar5]);
      auStack_10028[lVar5] = 0;
    }
  }
  printf("Micro allocation test took %d milliseconds.\r\n",0);
  srand(0);
  iVar7 = 40000000;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    uVar2 = rand();
    if ((void *)auStack_10028[uVar2 & 0x1fff] == (void *)0x0) {
      uVar3 = rand();
      uVar4 = rand();
      uVar1 = (uVar3 & 0x3f) + 0x100;
      if ((uVar4 & 0x7f) != 0) {
        uVar1 = uVar3 & 0x3f;
      }
      pvVar6 = malloc((ulong)uVar1);
    }
    else {
      free((void *)auStack_10028[uVar2 & 0x1fff]);
      pvVar6 = (void *)0x0;
    }
    auStack_10028[uVar2 & 0x1fff] = pvVar6;
  }
  for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 1) {
    if ((void *)auStack_10028[lVar5] != (void *)0x0) {
      free((void *)auStack_10028[lVar5]);
      auStack_10028[lVar5] = 0;
    }
  }
  printf("Standard malloc/free test took %d milliseconds.\r\n",0);
  releaseHeapManager(heap);
  return;
}

Assistant:

void performUnitTests(void)
{
    void *allocs[TEST_ALLOC_COUNT];
    for (NxU32 i=0; i<TEST_ALLOC_COUNT; i++)
    {
        allocs[i] = 0;
    }


    HeapManager *hm = createHeapManager(65536*32);


    {

      NxU32 stime = timeGetTime();
      srand(0);


      for (NxU32 i=0; i<TEST_RUN; i++)
      {
          NxU32 index = rand()&(TEST_ALLOC_COUNT-1);
          if ( allocs[index] )
          {
#if TEST_INLINE
              heap_free(hm, allocs[index] );
#else
              hm->heap_free( allocs[index] );
#endif
              allocs[index] = 0;
          }
          else
          {
              NxU32 asize = (rand()&TEST_SIZE);
			  if ( (rand()&127)==0) asize+=256; // one out of every 15 allocs is larger than 256 bytes.
#if TEST_INLINE
              allocs[index] = heap_malloc(hm,asize);
#else
              allocs[index] = hm->heap_malloc(asize);
#endif
          }
      }

      for (NxU32 i=0; i<TEST_ALLOC_COUNT; i++)
      {
          if ( allocs[i] )
          {
#if TEST_INLINE
              heap_free(hm,allocs[i] );
#else
              hm->heap_free(allocs[i] );
#endif
			  allocs[i] = 0;
          }
      }

      NxU32 etime = timeGetTime();
      printf("Micro allocation test took %d milliseconds.\r\n", etime - stime );

    }

    {

      NxU32 stime = timeGetTime();
      srand(0);


      for (NxU32 i=0; i<TEST_RUN; i++)
      {
          NxU32 index = rand()&(TEST_ALLOC_COUNT-1);
          if ( allocs[index] )
          {
              ::free( allocs[index] );
              allocs[index] = 0;
          }
          else
          {
              NxU32 asize = (rand()&TEST_SIZE);
			  if ( (rand()&127)==0) asize+=256; // one out of every 15 allocs is larger than 256 bytes.
              allocs[index] = ::malloc(asize);
          }
      }

      for (NxU32 i=0; i<TEST_ALLOC_COUNT; i++)
      {
          if ( allocs[i] )
          {
              ::free(allocs[i] );
			  allocs[i] = 0;
          }
      }

      NxU32 etime = timeGetTime();
      printf("Standard malloc/free test took %d milliseconds.\r\n", etime - stime );

    }

    releaseHeapManager(hm);
}